

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void __thiscall Diligent::FixedBlockMemoryAllocator::CreateNewPage(FixedBlockMemoryAllocator *this)

{
  char (*in_RCX) [16];
  string msg;
  string local_30;
  
  if (this->m_BlockSize == 0) {
    FormatString<char[26],char[16]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_BlockSize > 0",
               in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"CreateNewPage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xcc);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::
  vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::IMemoryAllocator>>
  ::emplace_back<Diligent::FixedBlockMemoryAllocator&>
            ((vector<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,Diligent::IMemoryAllocator>>
              *)&this->m_PagePool,this);
  local_30._M_dataplus._M_p =
       (pointer)(((long)(this->m_PagePool).
                        super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_PagePool).
                        super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
  std::__detail::
  _Insert<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  ::insert((_Insert<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            *)&this->m_AvailablePages,(value_type *)&local_30);
  std::__detail::
  _Rehash_base<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<void_*,_std::pair<void_*const,_unsigned_long>,_Diligent::STDAllocator<std::pair<void_*const,_unsigned_long>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&this->m_AddrToPageId,
            (ulong)this->m_NumBlocksInPage *
            ((long)(this->m_PagePool).
                   super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_PagePool).
                   super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  return;
}

Assistant:

void FixedBlockMemoryAllocator::CreateNewPage()
{
    VERIFY_EXPR(m_BlockSize > 0);
    m_PagePool.emplace_back(*this);
    m_AvailablePages.insert(m_PagePool.size() - 1);
    m_AddrToPageId.reserve(m_PagePool.size() * m_NumBlocksInPage);
}